

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

double units::convert<units::unit,units::unit>(double val,unit *start,unit *result)

{
  bool bVar1;
  unit_data uVar2;
  undefined1 extraout_DL;
  undefined1 uVar3;
  undefined1 extraout_DL_00;
  undefined7 extraout_var;
  undefined7 uVar4;
  undefined7 extraout_var_00;
  unit_data uVar5;
  double dVar6;
  unit_data base_result;
  unit local_30;
  unit local_28;
  
  bVar1 = unit::operator==(start,result);
  if (bVar1) {
    return val;
  }
  uVar5 = start->base_units_;
  if (start->multiplier_ == 1.0 && uVar5 == (unit_data)0x30000000) {
    return val;
  }
  uVar2 = result->base_units_;
  if (result->multiplier_ == 1.0 && uVar2 == (unit_data)0x30000000) {
    return val;
  }
  if (((((uint)uVar5 | (uint)uVar2) >> 0x1e & 1) != 0) &&
     ((((uint)uVar2 ^ (uint)uVar5) & 0xfffffff) == 0)) {
    dVar6 = detail::convertFlaggedUnits<units::unit,units::unit>(val,start,result,NAN);
    if (!NAN(dVar6)) {
      return dVar6;
    }
    uVar5 = start->base_units_;
    uVar2 = result->base_units_;
  }
  if ((int)((uint)uVar5 | (uint)uVar2) < 0) {
    if ((((uint)uVar2 ^ (uint)uVar5) & 0x307ffff) != 0) {
      return NAN;
    }
    local_30.multiplier_ = (float)uVar5;
    dVar6 = precise::equations::convert_equnit_to_value(val,(unit_data *)&local_30);
    local_30.multiplier_ = (float)result->base_units_;
    dVar6 = precise::equations::convert_value_to_equnit
                      ((dVar6 * (double)start->multiplier_) / (double)result->multiplier_,
                       (unit_data *)&local_30);
    return dVar6;
  }
  if (uVar2 != uVar5) {
    if (((uint)uVar5 >> 0x1c & 1) == 0) {
      if (((uint)uVar2 >> 0x1c & 1) != 0) {
LAB_00366c94:
        local_30 = *start;
        local_28 = *result;
        dVar6 = puconversion::assumedBase(&local_30,&local_28);
        if (NAN(dVar6)) {
          return NAN;
        }
        dVar6 = convert<units::unit,units::unit>(val,start,result,dVar6);
        return dVar6;
      }
    }
    else {
      if (((uint)uVar2 >> 0x1c & 1) == 0) goto LAB_00366c94;
      local_30 = *start;
      bVar1 = unit::operator==(&local_30,(unit *)&pu);
      if (bVar1) {
        return val;
      }
      local_28 = *result;
      bVar1 = unit::operator==(&local_28,(unit *)&pu);
      if (bVar1) {
        return val;
      }
      local_30.multiplier_ = (float)start->base_units_;
      local_28.multiplier_ = (float)result->base_units_;
      dVar6 = puconversion::knownConversions(val,(unit_data *)&local_30,(unit_data *)&local_28);
      if (!NAN(dVar6)) {
        return dVar6;
      }
      uVar5 = start->base_units_;
      uVar2 = result->base_units_;
    }
    local_30.multiplier_ = (float)uVar2;
    if ((((uint)uVar2 ^ (uint)uVar5) & 0xfffffff) != 0) {
      if (((((uint)uVar2 ^ (uint)uVar5) & 0x307ffff) == 0) &&
         (dVar6 = detail::convertCountingUnits<units::unit,units::unit>(val,start,result),
         !NAN(dVar6))) {
        return dVar6;
      }
      uVar2 = detail::unit_data::inv((unit_data *)&local_30);
      if ((((uint)uVar2 ^ (uint)uVar5) & 0xfffffff) == 0) {
        return 1.0 / ((double)result->multiplier_ * (double)start->multiplier_ * val);
      }
      if (((((start->base_units_).field_0x3 & 0x40) != 0) ||
          (uVar3 = extraout_DL, uVar4 = extraout_var, ((result->base_units_).field_0x3 & 0x40) != 0)
          ) && (dVar6 = detail::extraValidConversions<units::unit,units::unit>
                                  ((detail *)start,val,result,
                                   (unit *)CONCAT71(extraout_var,extraout_DL)),
               uVar3 = extraout_DL_00, uVar4 = extraout_var_00, !NAN(dVar6))) {
        return dVar6;
      }
      dVar6 = detail::otherUsefulConversions<units::unit,units::unit>
                        ((detail *)start,val,result,(unit *)CONCAT71(uVar4,uVar3));
      return dVar6;
    }
  }
  return ((double)start->multiplier_ * val) / (double)result->multiplier_;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}